

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall leveldb::DBImpl::InstallCompactionResults(DBImpl *this,CompactionState *compact)

{
  Logger *info_log;
  Compaction *this_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  VersionEdit *pVVar5;
  Output *pOVar6;
  reference pvVar7;
  VersionEdit *mu;
  undefined8 *in_RDX;
  Output *out;
  size_t i;
  int level;
  CompactionState *compact_local;
  DBImpl *this_local;
  
  port::Mutex::AssertHeld((Mutex *)&compact[3].smallest_snapshot);
  info_log = (Logger *)compact[1].smallest_snapshot;
  uVar1 = Compaction::num_input_files((Compaction *)*in_RDX,0);
  uVar2 = Compaction::level((Compaction *)*in_RDX);
  uVar3 = Compaction::num_input_files((Compaction *)*in_RDX,1);
  iVar4 = Compaction::level((Compaction *)*in_RDX);
  Log(info_log,"Compacted %d@%d + %d@%d files => %lld bytes",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,
      (ulong)(iVar4 + 1),in_RDX[7]);
  this_00 = (Compaction *)*in_RDX;
  pVVar5 = Compaction::edit((Compaction *)*in_RDX);
  Compaction::AddInputDeletions(this_00,pVVar5);
  iVar4 = Compaction::level((Compaction *)*in_RDX);
  out = (Output *)0x0;
  while( true ) {
    pOVar6 = (Output *)
             std::
             vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
             ::size((vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                     *)(in_RDX + 2));
    if (pOVar6 <= out) break;
    pvVar7 = std::
             vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
             ::operator[]((vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                           *)(in_RDX + 2),(size_type)out);
    pVVar5 = Compaction::edit((Compaction *)*in_RDX);
    VersionEdit::AddFile
              (pVVar5,iVar4 + 1,pvVar7->number,pvVar7->file_size,&pvVar7->smallest,&pvVar7->largest)
    ;
    out = (Output *)((long)&out->number + 1);
  }
  pVVar5 = (VersionEdit *)compact[8].outfile;
  mu = Compaction::edit((Compaction *)*in_RDX);
  VersionSet::LogAndApply((VersionSet *)this,pVVar5,(Mutex *)mu);
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::InstallCompactionResults(CompactionState* compact) {
  mutex_.AssertHeld();
  Log(options_.info_log, "Compacted %d@%d + %d@%d files => %lld bytes",
      compact->compaction->num_input_files(0), compact->compaction->level(),
      compact->compaction->num_input_files(1), compact->compaction->level() + 1,
      static_cast<long long>(compact->total_bytes));

  // Add compaction outputs
  compact->compaction->AddInputDeletions(compact->compaction->edit());
  const int level = compact->compaction->level();
  for (size_t i = 0; i < compact->outputs.size(); i++) {
    const CompactionState::Output& out = compact->outputs[i];
    compact->compaction->edit()->AddFile(level + 1, out.number, out.file_size,
                                         out.smallest, out.largest);
  }
  return versions_->LogAndApply(compact->compaction->edit(), &mutex_);
}